

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImFont::AddGlyph(ImFont *this,ImWchar codepoint,float x0,float y0,float x1,float y1,float u0,
                float v0,float u1,float v1,float advance_x)

{
  ImFontGlyph *pIVar1;
  ImFontConfig *pIVar2;
  long lVar3;
  float fVar4;
  
  ImVector<ImFontGlyph>::resize(&this->Glyphs,(this->Glyphs).Size + 1);
  pIVar1 = (this->Glyphs).Data;
  lVar3 = (long)(this->Glyphs).Size;
  pIVar1[lVar3 + -1].Codepoint = codepoint;
  pIVar1[lVar3 + -1].X0 = x0;
  pIVar1[lVar3 + -1].Y0 = y0;
  pIVar1[lVar3 + -1].X1 = x1;
  pIVar1[lVar3 + -1].Y1 = y1;
  pIVar1[lVar3 + -1].U0 = u0;
  pIVar1[lVar3 + -1].V0 = v0;
  pIVar1[lVar3 + -1].U1 = u1;
  pIVar1[lVar3 + -1].V1 = v1;
  pIVar2 = this->ConfigData;
  fVar4 = (pIVar2->GlyphExtraSpacing).x + advance_x;
  pIVar1[lVar3 + -1].AdvanceX = fVar4;
  if (pIVar2->PixelSnapH == true) {
    pIVar1[lVar3 + -1].AdvanceX = (float)(int)(fVar4 + 0.5);
  }
  this->DirtyLookupTables = true;
  this->MetricsTotalSurface =
       this->MetricsTotalSurface +
       (int)((float)this->ContainerAtlas->TexHeight * (v1 - v0) + 1.99) *
       (int)((float)this->ContainerAtlas->TexWidth * (u1 - u0) + 1.99);
  return;
}

Assistant:

void ImFont::AddGlyph(ImWchar codepoint, float x0, float y0, float x1, float y1, float u0, float v0, float u1, float v1, float advance_x)
{
    Glyphs.resize(Glyphs.Size + 1);
    ImFontGlyph& glyph = Glyphs.back();
    glyph.Codepoint = (ImWchar)codepoint;
    glyph.X0 = x0;
    glyph.Y0 = y0;
    glyph.X1 = x1;
    glyph.Y1 = y1;
    glyph.U0 = u0;
    glyph.V0 = v0;
    glyph.U1 = u1;
    glyph.V1 = v1;
    glyph.AdvanceX = advance_x + ConfigData->GlyphExtraSpacing.x;  // Bake spacing into AdvanceX

    if (ConfigData->PixelSnapH)
        glyph.AdvanceX = (float)(int)(glyph.AdvanceX + 0.5f);

    // Compute rough surface usage metrics (+1 to account for average padding, +0.99 to round)
    DirtyLookupTables = true;
    MetricsTotalSurface += (int)((glyph.U1 - glyph.U0) * ContainerAtlas->TexWidth + 1.99f) * (int)((glyph.V1 - glyph.V0) * ContainerAtlas->TexHeight + 1.99f);
}